

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::BVHNIntersector1<4,_16781328,_true,_embree::sse2::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  char cVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  uint uVar36;
  uint uVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar38;
  float fVar39;
  undefined1 auVar35 [16];
  float fVar40;
  vfloat4 a0;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar50;
  float fVar51;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  undefined1 auVar49 [16];
  float fVar53;
  float fVar54;
  float fVar58;
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar63;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar65;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar60;
  float fVar64;
  float fVar66;
  undefined1 auVar57 [16];
  undefined1 auVar67 [12];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  vfloat4 a;
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  undefined1 auVar78 [16];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar5 = ray->tfar, 0.0 <= fVar5)) {
    aVar6 = (ray->dir).field_0.field_1;
    fVar53 = aVar6.x;
    fVar58 = aVar6.y;
    fVar61 = aVar6.z;
    aVar65 = aVar6.field_3;
    fVar29 = fVar58 * fVar58;
    fVar30 = fVar61 * fVar61;
    fVar31 = aVar65.w * aVar65.w;
    fVar40 = fVar29 + fVar53 * fVar53 + fVar30;
    auVar45._0_8_ = CONCAT44(fVar29 + fVar29 + fVar31,fVar40);
    auVar45._8_4_ = fVar29 + fVar30 + fVar30;
    auVar45._12_4_ = fVar29 + fVar31 + fVar31;
    auVar47._8_4_ = auVar45._8_4_;
    auVar47._0_8_ = auVar45._0_8_;
    auVar47._12_4_ = auVar45._12_4_;
    auVar45 = rsqrtss(auVar47,auVar45);
    fVar29 = auVar45._0_4_;
    local_818[0] = fVar29 * 1.5 - fVar29 * fVar29 * fVar40 * 0.5 * fVar29;
    fVar29 = fVar53 * local_818[0];
    fVar30 = fVar58 * local_818[0];
    fVar31 = fVar61 * local_818[0];
    fVar73 = -fVar30;
    fVar40 = -fVar31;
    auVar67._8_4_ = 0xffffffff;
    auVar67._0_8_ = 0xffffffffffffffff;
    if (fVar73 * fVar73 + fVar31 * fVar31 + 0.0 <= fVar29 * fVar29 + fVar40 * fVar40 + 0.0) {
      auVar67 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar59 = (float)((uint)fVar31 & auVar67._4_4_);
    fVar40 = (float)(~auVar67._0_4_ & (uint)fVar40);
    fVar63 = (float)(~auVar67._8_4_ & (uint)fVar29 | (uint)fVar73 & auVar67._8_4_);
    fVar73 = fVar59 * fVar59;
    fVar62 = fVar63 * fVar63;
    fVar74 = fVar73 + fVar40 * fVar40 + fVar62;
    auVar80._0_8_ = CONCAT44(fVar73 + fVar73 + 0.0,fVar74);
    auVar80._8_4_ = fVar73 + fVar62 + fVar62;
    auVar80._12_4_ = fVar73 + 0.0 + 0.0;
    auVar83._8_4_ = auVar80._8_4_;
    auVar83._0_8_ = auVar80._0_8_;
    auVar83._12_4_ = auVar80._12_4_;
    auVar45 = rsqrtss(auVar83,auVar80);
    fVar73 = auVar45._0_4_;
    fVar73 = fVar73 * 1.5 - fVar73 * fVar73 * fVar74 * 0.5 * fVar73;
    fVar40 = fVar73 * fVar40;
    fVar59 = fVar73 * fVar59;
    fVar63 = fVar73 * fVar63;
    fVar62 = fVar59 * fVar29 - fVar30 * fVar40;
    fVar74 = fVar63 * fVar30 - fVar31 * fVar59;
    fVar70 = fVar40 * fVar31 - fVar29 * fVar63;
    fVar72 = fVar73 * 0.0 * aVar65.w * local_818[0] - aVar65.w * local_818[0] * fVar73 * 0.0;
    fVar73 = fVar74 * fVar74;
    fVar71 = fVar70 * fVar70;
    fVar72 = fVar72 * fVar72;
    fVar77 = fVar71 + fVar73 + fVar62 * fVar62;
    auVar78._0_8_ = CONCAT44(fVar72 + fVar73 + fVar73,fVar77);
    auVar78._8_4_ = fVar71 + fVar73 + fVar71;
    auVar78._12_4_ = fVar72 + fVar73 + fVar72;
    auVar56._8_4_ = auVar78._8_4_;
    auVar56._0_8_ = auVar78._0_8_;
    auVar56._12_4_ = auVar78._12_4_;
    auVar45 = rsqrtss(auVar56,auVar78);
    fVar73 = auVar45._0_4_;
    fVar73 = fVar73 * 1.5 - fVar73 * fVar73 * fVar77 * 0.5 * fVar73;
    local_7e8._4_4_ = fVar73 * fVar62;
    local_7e8._0_4_ = fVar63;
    local_7e8._8_4_ = local_818[0] * fVar31;
    local_7e8._12_4_ = 0;
    local_808._4_4_ = fVar73 * fVar74;
    local_808._0_4_ = fVar40;
    local_808._8_4_ = local_818[0] * fVar29;
    local_808._12_4_ = 0;
    local_7f8._4_4_ = fVar73 * fVar70;
    local_7f8._0_4_ = fVar59;
    local_7f8._8_4_ = local_818[0] * fVar30;
    local_7f8._12_4_ = 0;
    puVar19 = local_7d0;
    local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar30 = (ray->org).field_0.m128[0];
    fVar31 = (ray->org).field_0.m128[1];
    fVar40 = (ray->org).field_0.m128[2];
    fVar73 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar29 = 0.0;
    if (0.0 <= fVar73) {
      fVar29 = fVar73;
    }
    auVar45 = divps(_DAT_01f46a60,(undefined1  [16])aVar6);
    fVar73 = (float)(~-(uint)(1e-18 <= ABS(fVar53)) & 0x5d5e0b6b |
                    auVar45._0_4_ & -(uint)(1e-18 <= ABS(fVar53)));
    fVar59 = (float)(~-(uint)(1e-18 <= ABS(fVar58)) & 0x5d5e0b6b |
                    auVar45._4_4_ & -(uint)(1e-18 <= ABS(fVar58)));
    fVar62 = (float)(~-(uint)(1e-18 <= ABS(fVar61)) & 0x5d5e0b6b |
                    auVar45._8_4_ & -(uint)(1e-18 <= ABS(fVar61)));
    fVar63 = fVar73 * 0.99999964;
    fVar74 = fVar59 * 0.99999964;
    fVar70 = fVar62 * 0.99999964;
    fVar73 = fVar73 * 1.0000004;
    fVar59 = fVar59 * 1.0000004;
    fVar62 = fVar62 * 1.0000004;
    uVar21 = (ulong)(fVar63 < 0.0) * 0x10;
    uVar18 = (ulong)(fVar74 < 0.0) << 4 | 0x20;
    uVar20 = (ulong)(fVar70 < 0.0) << 4 | 0x40;
    auVar68._4_4_ = fVar29;
    auVar68._0_4_ = fVar29;
    auVar68._8_4_ = fVar29;
    auVar68._12_4_ = fVar29;
    auVar81._4_4_ = fVar5;
    auVar81._0_4_ = fVar5;
    auVar81._8_4_ = fVar5;
    auVar81._12_4_ = fVar5;
LAB_0056a5f1:
    if (puVar19 != &local_7d8) {
      uVar15 = puVar19[-1];
      puVar19 = puVar19 + -1;
      do {
        fVar5 = (ray->dir).field_0.m128[3];
        fVar29 = 1.0 - fVar5;
        fVar71 = fVar29 * 0.0;
        do {
          if ((uVar15 & 8) != 0) {
            cVar13 = (**(code **)((long)This->leafIntersector +
                                 (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 8))
                               (local_818,ray,context);
            if (cVar13 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_0056a5f1;
          }
          uVar16 = (uint)uVar15 & 7;
          uVar14 = uVar15 & 0xfffffffffffffff0;
          if (uVar16 == 3) {
            fVar89 = fVar53 * *(float *)(uVar14 + 0x20) +
                     fVar58 * *(float *)(uVar14 + 0x50) + fVar61 * *(float *)(uVar14 + 0x80);
            fVar92 = fVar53 * *(float *)(uVar14 + 0x24) +
                     fVar58 * *(float *)(uVar14 + 0x54) + fVar61 * *(float *)(uVar14 + 0x84);
            fVar93 = fVar53 * *(float *)(uVar14 + 0x28) +
                     fVar58 * *(float *)(uVar14 + 0x58) + fVar61 * *(float *)(uVar14 + 0x88);
            fVar94 = fVar53 * *(float *)(uVar14 + 0x2c) +
                     fVar58 * *(float *)(uVar14 + 0x5c) + fVar61 * *(float *)(uVar14 + 0x8c);
            fVar96 = fVar53 * *(float *)(uVar14 + 0x30) +
                     fVar58 * *(float *)(uVar14 + 0x60) + fVar61 * *(float *)(uVar14 + 0x90);
            fVar99 = fVar53 * *(float *)(uVar14 + 0x34) +
                     fVar58 * *(float *)(uVar14 + 100) + fVar61 * *(float *)(uVar14 + 0x94);
            fVar100 = fVar53 * *(float *)(uVar14 + 0x38) +
                      fVar58 * *(float *)(uVar14 + 0x68) + fVar61 * *(float *)(uVar14 + 0x98);
            fVar101 = fVar53 * *(float *)(uVar14 + 0x3c) +
                      fVar58 * *(float *)(uVar14 + 0x6c) + fVar61 * *(float *)(uVar14 + 0x9c);
            fVar72 = fVar53 * *(float *)(uVar14 + 0x40) +
                     fVar58 * *(float *)(uVar14 + 0x70) + fVar61 * *(float *)(uVar14 + 0xa0);
            fVar77 = fVar53 * *(float *)(uVar14 + 0x44) +
                     fVar58 * *(float *)(uVar14 + 0x74) + fVar61 * *(float *)(uVar14 + 0xa4);
            fVar84 = fVar53 * *(float *)(uVar14 + 0x48) +
                     fVar58 * *(float *)(uVar14 + 0x78) + fVar61 * *(float *)(uVar14 + 0xa8);
            fVar85 = fVar53 * *(float *)(uVar14 + 0x4c) +
                     fVar58 * *(float *)(uVar14 + 0x7c) + fVar61 * *(float *)(uVar14 + 0xac);
            uVar32 = (uint)DAT_01f46710;
            uVar36 = DAT_01f46710._4_4_;
            uVar37 = DAT_01f46710._8_4_;
            uVar38 = DAT_01f46710._12_4_;
            uVar16 = -(uint)(1e-18 <= (float)((uint)fVar89 & uVar32));
            uVar24 = -(uint)(1e-18 <= (float)((uint)fVar92 & uVar36));
            uVar26 = -(uint)(1e-18 <= (float)((uint)fVar93 & uVar37));
            uVar28 = -(uint)(1e-18 <= (float)((uint)fVar94 & uVar38));
            auVar90._0_4_ = (uint)fVar89 & uVar16;
            auVar90._4_4_ = (uint)fVar92 & uVar24;
            auVar90._8_4_ = (uint)fVar93 & uVar26;
            auVar90._12_4_ = (uint)fVar94 & uVar28;
            auVar87._0_8_ = CONCAT44(~uVar24,~uVar16) & 0x219392ef219392ef;
            auVar87._8_4_ = ~uVar26 & 0x219392ef;
            auVar87._12_4_ = ~uVar28 & 0x219392ef;
            auVar87 = auVar87 | auVar90;
            uVar16 = -(uint)(1e-18 <= (float)((uint)fVar96 & uVar32));
            uVar24 = -(uint)(1e-18 <= (float)((uint)fVar99 & uVar36));
            uVar26 = -(uint)(1e-18 <= (float)((uint)fVar100 & uVar37));
            uVar28 = -(uint)(1e-18 <= (float)((uint)fVar101 & uVar38));
            auVar97._0_4_ = (uint)fVar96 & uVar16;
            auVar97._4_4_ = (uint)fVar99 & uVar24;
            auVar97._8_4_ = (uint)fVar100 & uVar26;
            auVar97._12_4_ = (uint)fVar101 & uVar28;
            auVar91._0_8_ = CONCAT44(~uVar24,~uVar16) & 0x219392ef219392ef;
            auVar91._8_4_ = ~uVar26 & 0x219392ef;
            auVar91._12_4_ = ~uVar28 & 0x219392ef;
            auVar91 = auVar91 | auVar97;
            uVar16 = -(uint)(1e-18 <= (float)((uint)fVar72 & uVar32));
            uVar24 = -(uint)(1e-18 <= (float)((uint)fVar77 & uVar36));
            uVar26 = -(uint)(1e-18 <= (float)((uint)fVar84 & uVar37));
            uVar28 = -(uint)(1e-18 <= (float)((uint)fVar85 & uVar38));
            auVar98._0_8_ = CONCAT44(~uVar24,~uVar16) & 0x219392ef219392ef;
            auVar98._8_4_ = ~uVar26 & 0x219392ef;
            auVar98._12_4_ = ~uVar28 & 0x219392ef;
            auVar12._4_4_ = (uint)fVar77 & uVar24;
            auVar12._0_4_ = (uint)fVar72 & uVar16;
            auVar12._8_4_ = (uint)fVar84 & uVar26;
            auVar12._12_4_ = (uint)fVar85 & uVar28;
            auVar98 = auVar98 | auVar12;
            auVar45 = rcpps(_DAT_01f46710,auVar87);
            fVar72 = auVar45._0_4_;
            fVar89 = auVar45._4_4_;
            fVar96 = auVar45._8_4_;
            fVar86 = auVar45._12_4_;
            fVar72 = (1.0 - auVar87._0_4_ * fVar72) * fVar72 + fVar72;
            fVar89 = (1.0 - auVar87._4_4_ * fVar89) * fVar89 + fVar89;
            fVar96 = (1.0 - auVar87._8_4_ * fVar96) * fVar96 + fVar96;
            fVar86 = (1.0 - auVar87._12_4_ * fVar86) * fVar86 + fVar86;
            auVar45 = rcpps(auVar45,auVar91);
            fVar77 = auVar45._0_4_;
            fVar92 = auVar45._4_4_;
            fVar99 = auVar45._8_4_;
            fVar88 = auVar45._12_4_;
            fVar77 = (1.0 - auVar91._0_4_ * fVar77) * fVar77 + fVar77;
            fVar92 = (1.0 - auVar91._4_4_ * fVar92) * fVar92 + fVar92;
            fVar99 = (1.0 - auVar91._8_4_ * fVar99) * fVar99 + fVar99;
            fVar88 = (1.0 - auVar91._12_4_ * fVar88) * fVar88 + fVar88;
            auVar45 = rcpps(auVar45,auVar98);
            fVar84 = auVar45._0_4_;
            fVar93 = auVar45._4_4_;
            fVar100 = auVar45._8_4_;
            fVar95 = auVar45._12_4_;
            fVar84 = (1.0 - auVar98._0_4_ * fVar84) * fVar84 + fVar84;
            fVar93 = (1.0 - auVar98._4_4_ * fVar93) * fVar93 + fVar93;
            fVar100 = (1.0 - auVar98._8_4_ * fVar100) * fVar100 + fVar100;
            fVar95 = (1.0 - auVar98._12_4_ * fVar95) * fVar95 + fVar95;
            fVar54 = *(float *)(uVar14 + 0x20) * fVar30 +
                     *(float *)(uVar14 + 0x50) * fVar31 +
                     *(float *)(uVar14 + 0x80) * fVar40 + *(float *)(uVar14 + 0xb0);
            fVar60 = *(float *)(uVar14 + 0x24) * fVar30 +
                     *(float *)(uVar14 + 0x54) * fVar31 +
                     *(float *)(uVar14 + 0x84) * fVar40 + *(float *)(uVar14 + 0xb4);
            fVar64 = *(float *)(uVar14 + 0x28) * fVar30 +
                     *(float *)(uVar14 + 0x58) * fVar31 +
                     *(float *)(uVar14 + 0x88) * fVar40 + *(float *)(uVar14 + 0xb8);
            fVar66 = *(float *)(uVar14 + 0x2c) * fVar30 +
                     *(float *)(uVar14 + 0x5c) * fVar31 +
                     *(float *)(uVar14 + 0x8c) * fVar40 + *(float *)(uVar14 + 0xbc);
            fVar44 = *(float *)(uVar14 + 0x30) * fVar30 +
                     *(float *)(uVar14 + 0x60) * fVar31 +
                     *(float *)(uVar14 + 0x90) * fVar40 + *(float *)(uVar14 + 0xc0);
            fVar50 = *(float *)(uVar14 + 0x34) * fVar30 +
                     *(float *)(uVar14 + 100) * fVar31 +
                     *(float *)(uVar14 + 0x94) * fVar40 + *(float *)(uVar14 + 0xc4);
            fVar51 = *(float *)(uVar14 + 0x38) * fVar30 +
                     *(float *)(uVar14 + 0x68) * fVar31 +
                     *(float *)(uVar14 + 0x98) * fVar40 + *(float *)(uVar14 + 200);
            fVar52 = *(float *)(uVar14 + 0x3c) * fVar30 +
                     *(float *)(uVar14 + 0x6c) * fVar31 +
                     *(float *)(uVar14 + 0x9c) * fVar40 + *(float *)(uVar14 + 0xcc);
            fVar85 = *(float *)(uVar14 + 0x40) * fVar30 +
                     *(float *)(uVar14 + 0x70) * fVar31 +
                     *(float *)(uVar14 + 0xa0) * fVar40 + *(float *)(uVar14 + 0xd0);
            fVar94 = *(float *)(uVar14 + 0x44) * fVar30 +
                     *(float *)(uVar14 + 0x74) * fVar31 +
                     *(float *)(uVar14 + 0xa4) * fVar40 + *(float *)(uVar14 + 0xd4);
            fVar101 = *(float *)(uVar14 + 0x48) * fVar30 +
                      *(float *)(uVar14 + 0x78) * fVar31 +
                      *(float *)(uVar14 + 0xa8) * fVar40 + *(float *)(uVar14 + 0xd8);
            fVar39 = *(float *)(uVar14 + 0x4c) * fVar30 +
                     *(float *)(uVar14 + 0x7c) * fVar31 +
                     *(float *)(uVar14 + 0xac) * fVar40 + *(float *)(uVar14 + 0xdc);
            auVar79._0_8_ =
                 CONCAT44(((*(float *)(uVar14 + 0xe4) * fVar5 + fVar71) - fVar60) * fVar89,
                          ((*(float *)(uVar14 + 0xe0) * fVar5 + fVar71) - fVar54) * fVar72);
            auVar79._8_4_ = ((*(float *)(uVar14 + 0xe8) * fVar5 + fVar71) - fVar64) * fVar96;
            auVar79._12_4_ = ((*(float *)(uVar14 + 0xec) * fVar5 + fVar71) - fVar66) * fVar86;
            auVar69._0_4_ = ((*(float *)(uVar14 + 0x110) * fVar5 + fVar29) - fVar54) * fVar72;
            auVar69._4_4_ = ((*(float *)(uVar14 + 0x114) * fVar5 + fVar29) - fVar60) * fVar89;
            auVar69._8_4_ = ((*(float *)(uVar14 + 0x118) * fVar5 + fVar29) - fVar64) * fVar96;
            auVar69._12_4_ = ((*(float *)(uVar14 + 0x11c) * fVar5 + fVar29) - fVar66) * fVar86;
            auVar76._0_8_ =
                 CONCAT44(((*(float *)(uVar14 + 0xf4) * fVar5 + fVar71) - fVar50) * fVar92,
                          ((*(float *)(uVar14 + 0xf0) * fVar5 + fVar71) - fVar44) * fVar77);
            auVar76._8_4_ = ((*(float *)(uVar14 + 0xf8) * fVar5 + fVar71) - fVar51) * fVar99;
            auVar76._12_4_ = ((*(float *)(uVar14 + 0xfc) * fVar5 + fVar71) - fVar52) * fVar88;
            auVar75._0_8_ =
                 CONCAT44(((*(float *)(uVar14 + 0x104) * fVar5 + fVar71) - fVar94) * fVar93,
                          ((*(float *)(uVar14 + 0x100) * fVar5 + fVar71) - fVar85) * fVar84);
            auVar75._8_4_ = ((*(float *)(uVar14 + 0x108) * fVar5 + fVar71) - fVar101) * fVar100;
            auVar75._12_4_ = ((*(float *)(uVar14 + 0x10c) * fVar5 + fVar71) - fVar39) * fVar95;
            auVar57._0_4_ = ((*(float *)(uVar14 + 0x120) * fVar5 + fVar29) - fVar44) * fVar77;
            auVar57._4_4_ = ((*(float *)(uVar14 + 0x124) * fVar5 + fVar29) - fVar50) * fVar92;
            auVar57._8_4_ = ((*(float *)(uVar14 + 0x128) * fVar5 + fVar29) - fVar51) * fVar99;
            auVar57._12_4_ = ((*(float *)(uVar14 + 300) * fVar5 + fVar29) - fVar52) * fVar88;
            auVar35._0_4_ = ((*(float *)(uVar14 + 0x130) * fVar5 + fVar29) - fVar85) * fVar84;
            auVar35._4_4_ = ((*(float *)(uVar14 + 0x134) * fVar5 + fVar29) - fVar94) * fVar93;
            auVar35._8_4_ = ((*(float *)(uVar14 + 0x138) * fVar5 + fVar29) - fVar101) * fVar100;
            auVar35._12_4_ = ((*(float *)(uVar14 + 0x13c) * fVar5 + fVar29) - fVar39) * fVar95;
            auVar49._8_4_ = auVar76._8_4_;
            auVar49._0_8_ = auVar76._0_8_;
            auVar49._12_4_ = auVar76._12_4_;
            auVar47 = minps(auVar49,auVar57);
            auVar43._8_4_ = auVar75._8_4_;
            auVar43._0_8_ = auVar75._0_8_;
            auVar43._12_4_ = auVar75._12_4_;
            auVar45 = minps(auVar43,auVar35);
            auVar47 = maxps(auVar47,auVar45);
            auVar82._8_4_ = auVar79._8_4_;
            auVar82._0_8_ = auVar79._0_8_;
            auVar82._12_4_ = auVar79._12_4_;
            auVar83 = minps(auVar82,auVar69);
            auVar80 = maxps(auVar79,auVar69);
            auVar56 = maxps(auVar76,auVar57);
            auVar45 = maxps(auVar75,auVar35);
            auVar56 = minps(auVar56,auVar45);
            auVar45 = maxps(auVar68,auVar83);
            auVar47 = maxps(auVar45,auVar47);
            auVar45 = minps(auVar81,auVar80);
            auVar45 = minps(auVar45,auVar56);
            iVar22 = -(uint)(auVar47._0_4_ * 0.99999964 <= auVar45._0_4_ * 1.0000004);
            iVar23 = -(uint)(auVar47._4_4_ * 0.99999964 <= auVar45._4_4_ * 1.0000004);
            iVar25 = -(uint)(auVar47._8_4_ * 0.99999964 <= auVar45._8_4_ * 1.0000004);
            iVar27 = -(uint)(auVar47._12_4_ * 0.99999964 <= auVar45._12_4_ * 1.0000004);
          }
          else {
            pfVar3 = (float *)(uVar14 + 0x80 + uVar21);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar21);
            pfVar4 = (float *)(uVar14 + 0x80 + uVar18);
            pfVar2 = (float *)(uVar14 + 0x20 + uVar18);
            auVar33._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar30) * fVar63;
            auVar33._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar30) * fVar63;
            auVar33._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar30) * fVar63;
            auVar33._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar30) * fVar63;
            auVar46._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar31) * fVar74;
            auVar46._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar31) * fVar74;
            auVar46._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar31) * fVar74;
            auVar46._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar31) * fVar74;
            pfVar2 = (float *)(uVar14 + 0x80 + uVar20);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar20);
            auVar41._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar40) * fVar70;
            auVar41._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar40) * fVar70;
            auVar41._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar40) * fVar70;
            auVar41._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar40) * fVar70;
            auVar47 = maxps(auVar46,auVar41);
            auVar45 = maxps(auVar68,auVar33);
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar21 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar21 ^ 0x10));
            auVar45 = maxps(auVar45,auVar47);
            auVar34._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar30) * fVar73;
            auVar34._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar30) * fVar73;
            auVar34._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar30) * fVar73;
            auVar34._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar30) * fVar73;
            pfVar3 = (float *)(uVar14 + 0x80 + (uVar18 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar18 ^ 0x10));
            pfVar4 = (float *)(uVar14 + 0x80 + (uVar20 ^ 0x10));
            pfVar2 = (float *)(uVar14 + 0x20 + (uVar20 ^ 0x10));
            auVar55._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar31) * fVar59;
            auVar55._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar31) * fVar59;
            auVar55._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar31) * fVar59;
            auVar55._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar31) * fVar59;
            auVar48._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar40) * fVar62;
            auVar48._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar40) * fVar62;
            auVar48._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar40) * fVar62;
            auVar48._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar40) * fVar62;
            auVar56 = minps(auVar55,auVar48);
            auVar47 = minps(auVar81,auVar34);
            auVar47 = minps(auVar47,auVar56);
            bVar8 = auVar45._0_4_ <= auVar47._0_4_;
            iVar22 = -(uint)bVar8;
            bVar9 = auVar45._4_4_ <= auVar47._4_4_;
            iVar23 = -(uint)bVar9;
            bVar10 = auVar45._8_4_ <= auVar47._8_4_;
            iVar25 = -(uint)bVar10;
            bVar11 = auVar45._12_4_ <= auVar47._12_4_;
            iVar27 = -(uint)bVar11;
            if (uVar16 == 6) {
              iVar22 = -(uint)((fVar5 < *(float *)(uVar14 + 0xf0) &&
                               *(float *)(uVar14 + 0xe0) <= fVar5) && bVar8);
              iVar23 = -(uint)((fVar5 < *(float *)(uVar14 + 0xf4) &&
                               *(float *)(uVar14 + 0xe4) <= fVar5) && bVar9);
              iVar25 = -(uint)((fVar5 < *(float *)(uVar14 + 0xf8) &&
                               *(float *)(uVar14 + 0xe8) <= fVar5) && bVar10);
              iVar27 = -(uint)((fVar5 < *(float *)(uVar14 + 0xfc) &&
                               *(float *)(uVar14 + 0xec) <= fVar5) && bVar11);
            }
          }
          auVar42._0_4_ = iVar22 << 0x1f;
          auVar42._4_4_ = iVar23 << 0x1f;
          auVar42._8_4_ = iVar25 << 0x1f;
          auVar42._12_4_ = iVar27 << 0x1f;
          uVar16 = movmskps((uint)uVar15,auVar42);
          if (uVar16 == 0) goto LAB_0056a5f1;
          uVar16 = uVar16 & 0xff;
          lVar7 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          uVar17 = (ulong)uVar16;
        } while (uVar16 == 0);
        do {
          *puVar19 = uVar15;
          puVar19 = puVar19 + 1;
          lVar7 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }